

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

void yy_2_param(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *n4;
  PVIPNode *pPVar1;
  PVIPNode *local_58;
  PVIPNode *local_40;
  uint local_2c;
  int attr;
  yythunk *thunk_local;
  int yyleng_local;
  char *yytext_local;
  GREG *G_local;
  
  local_2c = (uint)(G->val[-3] != (PVIPNode *)0x0);
  if (G->val[-2] != (PVIPNode *)0x0) {
    local_2c = local_2c | 2;
  }
  if (G->val[-1] != (PVIPNode *)0x0) {
    local_2c = local_2c | 4;
  }
  if (G->val[-6] == (PVIPNode *)0x0) {
    local_40 = PVIP_node_new_children(&G->data,PVIP_NODE_NOP);
  }
  else {
    local_40 = G->val[-6];
  }
  pPVar1 = G->val[-5];
  if (G->val[-4] == (PVIPNode *)0x0) {
    local_58 = PVIP_node_new_children(&G->data,PVIP_NODE_NOP);
  }
  else {
    local_58 = G->val[-4];
  }
  n4 = PVIP_node_new_int(&G->data,PVIP_NODE_INT,(long)(int)local_2c);
  pPVar1 = PVIP_node_new_children4(&G->data,PVIP_NODE_PARAM,local_40,pPVar1,local_58,n4);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_2_param(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define is_ref G->val[-1]
#define is_rw G->val[-2]
#define is_copy G->val[-3]
#define d G->val[-4]
#define v G->val[-5]
#define i G->val[-6]
  yyprintf((stderr, "do yy_2_param"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
        int attr = 0;\n\
        if (is_copy) {\n\
            attr |= PVIP_FUNC_ATTR_IS_COPY;\n\
        }\n\
        if (is_rw) {\n\
            attr |= PVIP_FUNC_ATTR_IS_RW;\n\
        }\n\
        if (is_ref) {\n\
            attr |= PVIP_FUNC_ATTR_IS_REF;\n\
        }\n\
        yy = CHILDREN4(PVIP_NODE_PARAM, MAYBE(i), v, MAYBE(d), PVIP_node_new_int(&(G->data), PVIP_NODE_INT, attr));\n\
    }\n"));
  
        int attr = 0;
        if (is_copy) {
            attr |= PVIP_FUNC_ATTR_IS_COPY;
        }
        if (is_rw) {
            attr |= PVIP_FUNC_ATTR_IS_RW;
        }
        if (is_ref) {
            attr |= PVIP_FUNC_ATTR_IS_REF;
        }
        yy = CHILDREN4(PVIP_NODE_PARAM, MAYBE(i), v, MAYBE(d), PVIP_node_new_int(&(G->data), PVIP_NODE_INT, attr));
    ;
#undef is_ref
#undef is_rw
#undef is_copy
#undef d
#undef v
#undef i
}